

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_lexical_analysis.cpp
# Opt level: O3

compile_errcode __thiscall
LexicalAnalysis::ParseDigit(LexicalAnalysis *this,Symbol *symbol,bool negative)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  compile_errcode cVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  
  uVar5 = (uint)(byte)this->ch;
  bVar2 = 1;
  uVar8 = 0xffffffff;
  bVar1 = 0;
  lVar10 = 0;
  do {
    lVar9 = lVar10;
    cVar3 = (char)uVar5;
    bVar1 = bVar1 | cVar3 == '0' & bVar2;
    lVar10 = (long)cVar3 + lVar9 * 10 + -0x30;
    uVar5 = fgetc((FILE *)this->fp_in);
    cVar4 = (char)uVar5;
    this->ch = cVar4;
    this->m_character_number = this->m_character_number + 1;
    uVar8 = uVar8 + 1;
    bVar2 = 0;
  } while ((byte)(cVar4 - 0x30U) < 10);
  ungetc((int)cVar4,(FILE *)this->fp_in);
  iVar7 = this->m_character_number + -1;
  this->m_character_number = iVar7;
  cVar6 = -0x7d2;
  if (uVar8 < 9) {
    if (negative) {
      lVar10 = 0x30 - ((long)cVar3 + lVar9 * 10);
    }
    if (((int)lVar10 == lVar10) && (!(bool)(lVar10 != 0 & bVar1))) {
      symbol->m_line_number = this->m_line_number;
      symbol->m_character_number = iVar7;
      symbol->m_name = INTERGER_SYM;
      Symbol::SetValue<int>(symbol,(int)lVar10);
      cVar6 = 0;
    }
  }
  return cVar6;
}

Assistant:

compile_errcode LexicalAnalysis::ParseDigit(Symbol& symbol, bool negative) {
    long sum = 0;
    int number_count = 0;
    bool first_flag = true;
    bool zero_flag = false;
    do {
        if (first_flag) {
            first_flag = false;
            if (ch == '0')
                zero_flag = true;
        }
        sum = sum * 10 + ch - '0';
        number_count++;
        GetChar();
    } while (c0_compile::isdigit(ch));
    UnGetChar();
    if (number_count < 10) {
        sum = negative ? (-1*sum) : sum;
        if (sum >= INT_MIN && sum <= INT_MAX) {
            if (sum != 0 && zero_flag) {
                return INVALID_DIGIT_ERROR;  // with front zero
            }
            symbol.SetLocate(m_line_number, m_character_number);
            symbol.SetName(INTERGER_SYM);
            symbol.SetValue<int>(sum);
            return COMPILE_OK;
        }
    }
    return INVALID_DIGIT_ERROR;
}